

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_global_decodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  uint uVar1;
  int iVar2;
  JSValueUnion p;
  int iVar3;
  int k;
  int iVar4;
  uint uVar5;
  JSValue v;
  StringBuffer local_50;
  
  v = JS_ToString(ctx,*argv);
  p = v.u;
  if ((int)v.tag != 6) {
    iVar4 = 0;
    string_buffer_init(ctx,&local_50,0);
    while (uVar5 = (uint)*(undefined8 *)((long)p.ptr + 4), iVar4 < (int)(uVar5 & 0x7fffffff)) {
      if ((int)uVar5 < 0) {
        uVar5 = (uint)*(ushort *)((long)p.ptr + (long)iVar4 * 2 + 0x10);
      }
      else {
        uVar5 = (uint)*(byte *)((long)p.ptr + (long)iVar4 + 0x10);
      }
      if (uVar5 == 0x25) {
        uVar1 = hex_decode(ctx,(JSString *)p.ptr,iVar4);
        if ((int)uVar1 < 0) {
LAB_00156f82:
          JS_FreeValue(ctx,v);
          (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
          return (JSValue)(ZEXT816(6) << 0x40);
        }
        k = iVar4 + 3;
        if (uVar1 < 0x80) {
          uVar5 = uVar1;
          iVar3 = k;
          if (isComponent == 0) {
            iVar2 = isURIReserved(uVar1);
            uVar5 = 0x25;
            iVar3 = iVar4 + 1;
            if (iVar2 == 0) {
              uVar5 = uVar1;
              iVar3 = k;
            }
          }
        }
        else {
          if ((uVar1 & 0x7fffffe0) == 0xc0) {
            uVar5 = uVar1 & 0x1f;
            iVar4 = 0x80;
            iVar3 = 1;
          }
          else if ((uVar1 & 0x7ffffff0) == 0xe0) {
            uVar5 = uVar1 & 0xf;
            iVar4 = 0x800;
            iVar3 = 2;
          }
          else {
            uVar5 = 0;
            iVar3 = 0;
            iVar4 = 1;
            if ((uVar1 & 0x7ffffff8) == 0xf0) {
              uVar5 = uVar1 & 7;
              iVar4 = 0x10000;
              iVar3 = 3;
            }
          }
          for (; 0 < iVar3; iVar3 = iVar3 + -1) {
            uVar1 = hex_decode(ctx,(JSString *)p.ptr,k);
            if ((int)uVar1 < 0) goto LAB_00156f82;
            if ((uVar1 & 0xc0) != 0x80) {
              k = k + 3;
              uVar5 = 0;
              break;
            }
            uVar5 = uVar5 << 6 | uVar1 & 0x3f;
            k = k + 3;
          }
          if ((((int)uVar5 < iVar4) || (0x10ffff < (int)uVar5)) ||
             (iVar3 = k, (uVar5 & 0xfffff800) == 0xd800)) {
            js_throw_URIError(ctx,"malformed UTF-8");
            goto LAB_00156f82;
          }
        }
      }
      else {
        iVar3 = iVar4 + 1;
      }
      iVar4 = iVar3;
      string_buffer_putc(&local_50,uVar5);
    }
    JS_FreeValue(ctx,v);
    v = string_buffer_end(&local_50);
  }
  return v;
}

Assistant:

static JSValue js_global_decodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1, n, c_min;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);

    p = JS_VALUE_GET_STRING(str);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        if (c == '%') {
            c = hex_decode(ctx, p, k);
            if (c < 0)
                goto fail;
            k += 3;
            if (c < 0x80) {
                if (!isComponent && isURIReserved(c)) {
                    c = '%';
                    k -= 2;
                }
            } else {
                /* Decode URI-encoded UTF-8 sequence */
                if (c >= 0xc0 && c <= 0xdf) {
                    n = 1;
                    c_min = 0x80;
                    c &= 0x1f;
                } else if (c >= 0xe0 && c <= 0xef) {
                    n = 2;
                    c_min = 0x800;
                    c &= 0xf;
                } else if (c >= 0xf0 && c <= 0xf7) {
                    n = 3;
                    c_min = 0x10000;
                    c &= 0x7;
                } else {
                    n = 0;
                    c_min = 1;
                    c = 0;
                }
                while (n-- > 0) {
                    c1 = hex_decode(ctx, p, k);
                    if (c1 < 0)
                        goto fail;
                    k += 3;
                    if ((c1 & 0xc0) != 0x80) {
                        c = 0;
                        break;
                    }
                    c = (c << 6) | (c1 & 0x3f);
                }
                if (c < c_min || c > 0x10FFFF ||
                    (c >= 0xd800 && c < 0xe000)) {
                    js_throw_URIError(ctx, "malformed UTF-8");
                    goto fail;
                }
            }
        } else {
            k++;
        }
        string_buffer_putc(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}